

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::ValidatePipelineResourceCompatibility
               (PipelineResourceDesc *ResDesc,SHADER_RESOURCE_TYPE Type,
               PIPELINE_RESOURCE_FLAGS ResourceFlags,Uint32 ArraySize,char *ShaderName,
               char *SignatureName)

{
  PipelineResourceDesc *pPVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  PIPELINE_RESOURCE_FLAGS PVar3;
  char *pcVar4;
  Char *Message;
  undefined1 local_a0 [8];
  string msg;
  char *local_78;
  char *local_70;
  char *local_68;
  Char *local_60;
  Char *local_58;
  char *local_50;
  char *SignatureName_local;
  char *ShaderName_local;
  Uint32 ArraySize_local;
  PIPELINE_RESOURCE_FLAGS ResourceFlags_local;
  SHADER_RESOURCE_TYPE Type_local;
  PipelineResourceDesc *ResDesc_local;
  
  local_50 = SignatureName;
  SignatureName_local = ShaderName;
  ShaderName_local._0_4_ = ArraySize;
  ShaderName_local._6_1_ = ResourceFlags;
  ShaderName_local._7_1_ = Type;
  _ArraySize_local = ResDesc;
  if (Type != ResDesc->ResourceType) {
    local_58 = GetShaderResourceTypeLiteralName(Type,false);
    local_60 = GetShaderResourceTypeLiteralName(_ArraySize_local->ResourceType,false);
    LogError<true,char[9],char_const*,char[32],char_const*,char[13],char_const*,char[37],char_const*,char[45],char_const*,char[3]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x34e,(char (*) [9])"Shader \'",&SignatureName_local,
               (char (*) [32])"\' contains resource with name \'",&ResDesc->Name,
               (char (*) [13])"\' and type \'",&local_58,
               (char (*) [37])"\' that is not compatible with type \'",&local_60,
               (char (*) [45])"\' specified in pipeline resource signature \'",&local_50,
               (char (*) [3])"\'.");
  }
  PVar2 = operator&(ShaderName_local._6_1_,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  PVar3 = operator&(_ArraySize_local->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  pPVar1 = _ArraySize_local;
  if (PVar2 != PVar3) {
    PVar2 = operator&(ShaderName_local._6_1_,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    local_68 = " not";
    if (PVar2 != PIPELINE_RESOURCE_FLAG_NONE) {
      local_68 = "";
    }
    PVar2 = operator&(_ArraySize_local->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    local_70 = " not";
    if (PVar2 != PIPELINE_RESOURCE_FLAG_NONE) {
      local_70 = "";
    }
    LogError<true,char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x357,(char (*) [9])"Shader \'",&SignatureName_local,
               (char (*) [22])"\' contains resource \'",&pPVar1->Name,(char (*) [10])"\' that is",
               &local_68,
               (char (*) [101])
               " labeled as formatted buffer, while the same resource specified by the pipeline resource signature \'"
               ,&local_50,(char (*) [5])"\' is",&local_70,(char (*) [18])" labeled as such.");
  }
  PVar2 = operator&(ShaderName_local._6_1_,PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER);
  PVar3 = operator&(_ArraySize_local->Flags,PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER);
  if (PVar2 != PVar3) {
    PVar2 = operator&(ShaderName_local._6_1_,PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER);
    pPVar1 = _ArraySize_local;
    local_78 = "separate image";
    if (PVar2 != PIPELINE_RESOURCE_FLAG_NONE) {
      local_78 = "combined image sampler";
    }
    PVar2 = operator&(_ArraySize_local->Flags,PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER);
    pcVar4 = "separate image.";
    if (PVar2 != PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar4 = "combined image sampler.";
    }
    msg.field_2._8_8_ = pcVar4;
    LogError<true,char[9],char_const*,char[12],char_const*,char[3],char_const*,char[75],char_const*,char[6],char_const*>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x35f,(char (*) [9])"Shader \'",&SignatureName_local,(char (*) [12])"\' contains ",
               &local_78,(char (*) [3])0xc06dfc,&pPVar1->Name,
               (char (*) [75])
               "\', while the same resource is defined by the pipeline resource signature \'",
               &local_50,(char (*) [6])"\' as ",(char **)((long)&msg.field_2 + 8));
  }
  if (_ArraySize_local->ArraySize == 0) {
    FormatString<char[108]>
              ((string *)local_a0,
               (char (*) [108])
               "ResDesc.ArraySize can\'t be zero. This error should\'ve be caught by ValidatePipelineResourceSignatureDesc()."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x362);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if ((Uint32)ShaderName_local == 0) {
    PVar2 = operator&(_ArraySize_local->Flags,PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    if (PVar2 == PIPELINE_RESOURCE_FLAG_NONE) {
      LogError<true,char[9],char_const*,char[22],char_const*,char[65],char_const*,char[81]>
                (false,"ValidatePipelineResourceCompatibility",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x36c,(char (*) [9])"Shader \'",&SignatureName_local,
                 (char (*) [22])"\' contains resource \'",&_ArraySize_local->Name,
                 (char (*) [65])"\' that is a runtime-sized array, but in the resource signature \'"
                 ,&local_50,
                 (char (*) [81])
                 "\' the resource is defined without the PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY flag."
                );
    }
  }
  else if (_ArraySize_local->ArraySize < (Uint32)ShaderName_local) {
    LogError<true,char[9],char_const*,char[22],char_const*,char[21],unsigned_int,char[35],unsigned_int,char[49],char_const*,char[3]>
              (false,"ValidatePipelineResourceCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x375,(char (*) [9])"Shader \'",&SignatureName_local,
               (char (*) [22])"\' contains resource \'",&_ArraySize_local->Name,
               (char (*) [21])"\' whose array size (",(uint *)&ShaderName_local,
               (char (*) [35])") is greater than the array size (",&_ArraySize_local->ArraySize,
               (char (*) [49])") specified by the pipeline resource signature \'",&local_50,
               (char (*) [3])"\'.");
  }
  return;
}

Assistant:

void ValidatePipelineResourceCompatibility(const PipelineResourceDesc& ResDesc,
                                           SHADER_RESOURCE_TYPE        Type,
                                           PIPELINE_RESOURCE_FLAGS     ResourceFlags,
                                           Uint32                      ArraySize,
                                           const char*                 ShaderName,
                                           const char*                 SignatureName) noexcept(false)
{
    if (Type != ResDesc.ResourceType)
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource with name '", ResDesc.Name,
                            "' and type '", GetShaderResourceTypeLiteralName(Type), "' that is not compatible with type '",
                            GetShaderResourceTypeLiteralName(ResDesc.ResourceType), "' specified in pipeline resource signature '", SignatureName, "'.");
    }

    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER))
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                            "' that is", ((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) ? "" : " not"),
                            " labeled as formatted buffer, while the same resource specified by the pipeline resource signature '",
                            SignatureName, "' is", ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) ? "" : " not"),
                            " labeled as such.");
    }

    if ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER))
    {
        LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains ",
                            ((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) ? "combined image sampler" : "separate image"),
                            " '", ResDesc.Name, "', while the same resource is defined by the pipeline resource signature '",
                            SignatureName, "' as ", ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) ? "combined image sampler." : "separate image."));
    }

    VERIFY(ResDesc.ArraySize > 0, "ResDesc.ArraySize can't be zero. This error should've be caught by ValidatePipelineResourceSignatureDesc().");

    if (ArraySize == 0)
    {
        // ArraySize == 0 means that the resource is a runtime-sized array and ResDesc.ArraySize from the
        // resource signature may have any non-zero value.
        if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) == 0)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                                "' that is a runtime-sized array, but in the resource signature '", SignatureName,
                                "' the resource is defined without the PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY flag.");
        }
    }
    else
    {
        if (ResDesc.ArraySize < ArraySize)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", ResDesc.Name,
                                "' whose array size (", ArraySize, ") is greater than the array size (",
                                ResDesc.ArraySize, ") specified by the pipeline resource signature '", SignatureName, "'.");
        }

        //if (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY)
        //{
        //    LOG_WARNING_MESSAGE("Shader '", ShaderName, "' contains resource with name '", ResDesc.Name,
        //                        "' that is defined in resource signature '", SignatureName,
        //                        "' with flag PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY, but the resource is not a runtime-sized array.");
        //}
    }
}